

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

void whisper_free_state(whisper_state *state)

{
  whisper_batch batch;
  bool bVar1;
  reference ppgVar2;
  void *in_RDI;
  ggml_backend **backend;
  iterator __end2;
  iterator __begin2;
  vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *__range2;
  vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *__rhs;
  __normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
  *__lhs;
  whisper_state *this;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  int8_t *in_stack_ffffffffffffffa8;
  __normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
  local_48;
  long local_40;
  vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *local_38;
  __normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
  *p_Stack_30;
  whisper_state *pwStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  void *local_8;
  
  if (in_RDI != (void *)0x0) {
    local_8 = in_RDI;
    whisper_kv_cache_free((whisper_kv_cache *)0x1eac2f);
    whisper_kv_cache_free((whisper_kv_cache *)0x1eac43);
    whisper_kv_cache_free((whisper_kv_cache *)0x1eac57);
    memcpy(&local_38,(void *)((long)local_8 + 0x180),0x30);
    batch.token = (whisper_token *)local_18;
    batch._0_8_ = pwStack_20;
    batch.pos = (whisper_pos *)uStack_10;
    batch.n_seq_id = (int32_t *)in_stack_ffffffffffffff98;
    batch.seq_id = (whisper_seq_id **)in_stack_ffffffffffffffa0;
    batch.logits = in_stack_ffffffffffffffa8;
    whisper_batch_free(batch);
    ggml_backend_sched_free(*(undefined8 *)((long)local_8 + 0xa588));
    ggml_backend_sched_free(*(undefined8 *)((long)local_8 + 0xa5a8));
    ggml_backend_sched_free(*(undefined8 *)((long)local_8 + 0xa5c8));
    ggml_backend_sched_free(*(undefined8 *)((long)local_8 + 0xa5e8));
    local_40 = (long)local_8 + 0xa570;
    local_48._M_current =
         (ggml_backend **)
         std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::begin(local_38);
    std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::end(local_38);
    __rhs = local_38;
    __lhs = p_Stack_30;
    this = pwStack_20;
    while (bVar1 = __gnu_cxx::operator!=
                             (__lhs,(__normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
                                     *)__rhs), bVar1) {
      ppgVar2 = __gnu_cxx::
                __normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
                ::operator*(&local_48);
      ggml_backend_free(*ppgVar2);
      __gnu_cxx::
      __normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
      ::operator++(&local_48);
    }
    aheads_masks_free((whisper_aheads_masks *)0x1ead6c);
    if (local_8 != (void *)0x0) {
      whisper_state::~whisper_state(this);
      operator_delete(local_8,0xa740);
    }
  }
  return;
}

Assistant:

void whisper_free_state(struct whisper_state * state) {
    if (state) {
        whisper_kv_cache_free(state->kv_self);
        whisper_kv_cache_free(state->kv_cross);
        whisper_kv_cache_free(state->kv_pad);

#ifdef WHISPER_USE_COREML
        if (state->ctx_coreml != nullptr) {
            whisper_coreml_free(state->ctx_coreml);
            state->ctx_coreml = nullptr;
        }
#endif

#ifdef WHISPER_USE_OPENVINO
        if (state->ctx_openvino != nullptr) {
            whisper_openvino_free(state->ctx_openvino);
            state->ctx_openvino = nullptr;
        }
#endif

        whisper_batch_free(state->batch);

        ggml_backend_sched_free(state->sched_conv.sched);
        ggml_backend_sched_free(state->sched_encode.sched);
        ggml_backend_sched_free(state->sched_cross.sched);
        ggml_backend_sched_free(state->sched_decode.sched);

        for (auto & backend : state->backends) {
            ggml_backend_free(backend);
        }

        // [EXPERIMENTAL] Token-level timestamps with DTW
        aheads_masks_free(state->aheads_masks);

        delete state;
    }
}